

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

int TPZFMatrix<long_double>::Substitution
              (longdouble *ptr,int64_t rows,TPZFMatrix<long_double> *B,TPZVec<int> *index)

{
  longdouble lVar1;
  long lVar2;
  TPZFMatrix<long_double> *this;
  ostream *poVar3;
  int64_t iVar4;
  void *this_00;
  int *piVar5;
  longdouble *plVar6;
  TPZVec<int> *in_RCX;
  TPZFMatrix<long_double> *in_RDX;
  long in_RSI;
  long in_RDI;
  longdouble lVar7;
  TPZVec<long_double> v;
  longdouble sum;
  int64_t j;
  int64_t i;
  TPZFMatrix<long_double> *b;
  int64_t in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  undefined6 uStack_138;
  TPZVec<long_double> local_78;
  longdouble local_58;
  long local_40;
  long local_38;
  TPZFMatrix<long_double> *local_30;
  TPZVec<int> *local_28;
  long local_18;
  long local_10;
  int local_4;
  
  if (in_RDX == (TPZFMatrix<long_double> *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "static int TPZFMatrix<long double>::Substitution(const TVar *, int64_t, TPZFMatrix<TVar> *, const TPZVec<int> &) [TVar = long double]"
                            );
    poVar3 = std::operator<<(poVar3,"TPZFMatrix<>*B eh nulo");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
  }
  else {
    local_30 = in_RDX;
    local_28 = in_RCX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    iVar4 = TPZVec<int>::NElements(in_RCX);
    if ((iVar4 == local_18) &&
       (iVar4 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_30), iVar4 == local_18)) {
      local_58 = (longdouble)0;
      TPZVec<long_double>::TPZVec
                ((TPZVec<long_double> *)
                 CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 in_stack_fffffffffffffeb8);
      for (local_38 = 0; this = local_30, local_38 < local_18; local_38 = local_38 + 1) {
        piVar5 = TPZVec<int>::operator[](local_28,local_38);
        plVar6 = operator()(this,(long)*piVar5);
        lVar1 = *plVar6;
        plVar6 = TPZVec<long_double>::operator[](&local_78,local_38);
        *plVar6 = lVar1;
      }
      for (local_38 = 0; lVar2 = local_18, local_38 < local_18; local_38 = local_38 + 1) {
        local_58 = (longdouble)0;
        for (local_40 = 0; lVar1 = local_58, local_40 < local_38; local_40 = local_40 + 1) {
          lVar1 = *(longdouble *)(local_10 + (local_40 * local_18 + local_38) * 0x10);
          plVar6 = TPZVec<long_double>::operator[](&local_78,local_40);
          local_58 = lVar1 * *plVar6 + local_58;
        }
        plVar6 = TPZVec<long_double>::operator[](&local_78,local_38);
        *plVar6 = *plVar6 - lVar1;
      }
      while (local_38 = lVar2 + -1, -1 < local_38) {
        local_58 = (longdouble)0;
        for (local_40 = lVar2; local_40 < local_18; local_40 = local_40 + 1) {
          lVar1 = *(longdouble *)(local_10 + (local_40 * local_18 + local_38) * 0x10);
          plVar6 = TPZVec<long_double>::operator[](&local_78,local_40);
          local_58 = lVar1 * *plVar6 + local_58;
        }
        plVar6 = TPZVec<long_double>::operator[](&local_78,local_38);
        lVar7 = *plVar6 - local_58;
        lVar1 = *(longdouble *)(local_10 + (local_38 * local_18 + local_38) * 0x10);
        plVar6 = TPZVec<long_double>::operator[](&local_78,local_38);
        *plVar6 = lVar7 / lVar1;
        lVar2 = local_38;
      }
      for (local_38 = 0; local_38 < local_18; local_38 = local_38 + 1) {
        plVar6 = TPZVec<long_double>::operator[](&local_78,local_38);
        in_stack_fffffffffffffec4 = SUB104(*plVar6,0);
        uStack_138 = (undefined6)((unkuint10)*plVar6 >> 0x20);
        plVar6 = operator()(local_30,local_38);
        *plVar6 = (longdouble)CONCAT64(uStack_138,in_stack_fffffffffffffec4);
      }
      local_4 = 1;
      TPZVec<long_double>::~TPZVec
                ((TPZVec<long_double> *)
                 CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_266cdb);
      poVar3 = std::operator<<(poVar3,"this->fIndex = ");
      iVar4 = TPZVec<int>::NElements(local_28);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar4);
      poVar3 = std::operator<<(poVar3,"  b = ");
      iVar4 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_30);
      this_00 = (void *)std::ostream::operator<<(poVar3,iVar4);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int TPZFMatrix<TVar>::Substitution(const TVar *ptr, int64_t rows, TPZFMatrix<TVar> *B, const TPZVec<int> &index )
{
    
    if(!B){
        PZError << __PRETTY_FUNCTION__ << "TPZFMatrix<>*B eh nulo" << endl;
        return 0;
    }
    
    TPZFMatrix<TVar> &b = *B;
    
    
    
    if (index.NElements() != rows || b.Rows() != rows)
    {
        cout << "TMatrix::Substituicao ERRO : vetores com dimensões incompativeis:\n"
        << "this->fIndex = " << index.NElements() << "  b = " << b.Rows() << endl;
        return 0;
    }
    
    int64_t i,j;
    TVar sum = 0;
    
    TPZVec<TVar> v(rows);
    
    
    for (i=0;i<rows;i++)
    {
        v[i] = b(index[i]);
    }
    
    //Ly=b
    for (i=0;i<rows;i++)
    {
        sum = 0.;
        for (j=0;j<(i);j++) sum += SELECTEL(ptr,rows,i,j) * v[j];
        v[i] -= sum;
    }
    
    //Ux=y
    for (i=(rows-1);i>-1;i--)
    {
        sum = 0.;
        for (j=(i+1);j<rows;j++) sum += SELECTEL(ptr,rows,i,j) * v[j];
        v[i] = (v[i] - sum) / SELECTEL(ptr,rows,i,i);
    }
    
    for (i=0;i<rows;i++) b(i) = v[i];
    return 1;
}